

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall duckdb::BaseAppender::Flush(BaseAppender *this)

{
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  *this_00;
  pointer pCVar1;
  type pCVar2;
  InvalidInputException *this_01;
  string local_40;
  
  if (this->column == 0) {
    FlushChunk(this);
    this_00 = &this->collection;
    pCVar1 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->(this_00);
    if (pCVar1->count != 0) {
      pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
               ::operator*(this_00);
      (*this->_vptr_BaseAppender[4])(this,pCVar2);
      pCVar1 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
               ::operator->(this_00);
      ColumnDataCollection::Reset(pCVar1);
      this->column = 0;
    }
    return;
  }
  this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Failed to Flush appender: incomplete append to row!","");
  InvalidInputException::InvalidInputException(this_01,&local_40);
  __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::Flush() {
	// Check that all vectors have the same length before appending.
	if (column != 0) {
		throw InvalidInputException("Failed to Flush appender: incomplete append to row!");
	}

	FlushChunk();
	if (collection->Count() == 0) {
		return;
	}

	FlushInternal(*collection);
	collection->Reset();
	column = 0;
}